

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.c
# Opt level: O0

size_t utf8_range_ValidPrefix(char *data,size_t len)

{
  char *end_00;
  size_t sVar1;
  size_t len_local;
  char *data_local;
  char *end;
  char *data_original;
  char *local_10;
  
  if (len == 0) {
    local_10 = (char *)0x0;
  }
  else {
    end_00 = data + len;
    local_10 = utf8_range_SkipAscii(data,end_00);
    if ((long)end_00 - (long)local_10 < 0x10) {
      sVar1 = utf8_range_ValidateUTF8Naive(local_10,end_00,1);
      local_10 = local_10 + (sVar1 - (long)data);
    }
    else {
      sVar1 = utf8_range_ValidateUTF8Naive(local_10,end_00,1);
      local_10 = local_10 + (sVar1 - (long)data);
    }
  }
  return (size_t)local_10;
}

Assistant:

size_t utf8_range_ValidPrefix(const char* data, size_t len) {
  return utf8_range_Validate(data, len, /*return_position=*/1);
}